

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O1

void get_first_length(cio_buffered_stream *buffered_stream,void *handler_context,cio_error err,
                     cio_read_buffer *buffer,size_t num_bytes)

{
  byte bVar1;
  uint uVar2;
  ulong extraout_RAX;
  code *handler;
  char *reason;
  cio_websocket_status_code status_code;
  size_t num;
  
  if ((err != CIO_SUCCESS) && (get_first_length_cold_1(), (extraout_RAX & 1) == 0)) {
    return;
  }
  bVar1 = *buffer->fetch_ptr;
  buffer->fetch_ptr = buffer->fetch_ptr + num_bytes;
  if ((*(ushort *)((long)handler_context + 0x10) >> 10 & 1) == (ushort)(bVar1 >> 7)) {
    uVar2 = bVar1 & 0x7f;
    if ((byte)uVar2 < 0x7e) {
      *(ulong *)((long)handler_context + 8) = (ulong)uVar2;
      *(ulong *)handler_context = (ulong)uVar2;
      get_mask_or_payload((cio_websocket *)handler_context,buffered_stream,buffer);
    }
    else {
      if ((*(ushort *)((long)handler_context + 0x10) & 0x10) != 0) {
        get_first_length_cold_2();
        return;
      }
      if ((byte)uVar2 == 0x7e) {
        handler = get_length16;
        num = 2;
      }
      else {
        handler = get_length64;
        num = 8;
      }
      err = cio_buffered_stream_read_at_least(buffered_stream,buffer,num,handler,handler_context);
    }
    if (err == CIO_SUCCESS) {
      return;
    }
    reason = "error while start reading extended websocket frame length";
    status_code = CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR;
  }
  else {
    reason = "received unmasked frame on server websocket";
    err = CIO_PROTOCOL_NOT_SUPPORTED;
    status_code = CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR;
  }
  handle_error((cio_websocket *)handler_context,err,status_code,reason);
  return;
}

Assistant:

static void get_first_length(struct cio_buffered_stream *buffered_stream, void *handler_context, enum cio_error err, struct cio_read_buffer *buffer, size_t num_bytes)
{
	struct cio_websocket *websocket = (struct cio_websocket *)handler_context;
	if (cio_unlikely(handled_read_error(websocket, err))) {
		return;
	}

	uint8_t *ptr = cio_read_buffer_get_read_ptr(buffer);
	uint8_t field = *ptr;
	cio_read_buffer_consume(buffer, num_bytes);

	bool frame_is_masked = (field & WS_MASK_SET) == WS_MASK_SET;
	bool is_server = websocket->ws_private.ws_flags.is_server == 1U;
	if (frame_is_masked != is_server) {
		handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "received unmasked frame on server websocket");
		return;
	}

	field = field & (uint8_t)(~WS_MASK_SET);
	if (field <= CIO_WEBSOCKET_SMALL_FRAME_SIZE) {
		websocket->ws_private.remaining_read_frame_length = (size_t)field;
		websocket->ws_private.read_frame_length = (size_t)field;
		get_mask_or_payload(websocket, buffered_stream, buffer);
	} else {
		if (cio_unlikely(is_control_frame(websocket->ws_private.ws_flags.opcode))) {
			handle_error(websocket, CIO_PROTOCOL_NOT_SUPPORTED, CIO_WEBSOCKET_CLOSE_PROTOCOL_ERROR, "payload of control frame too long");
			return;
		}

		if (field == CIO_WEBSOCKET_SMALL_FRAME_SIZE + 1) {
			err = cio_buffered_stream_read_at_least(buffered_stream, buffer, sizeof(uint16_t), get_length16, websocket);
		} else {
			err = cio_buffered_stream_read_at_least(buffered_stream, buffer, sizeof(uint64_t), get_length64, websocket);
		}
	}

	if (cio_unlikely(err != CIO_SUCCESS)) {
		handle_error(websocket, err, CIO_WEBSOCKET_CLOSE_INTERNAL_ERROR, "error while start reading extended websocket frame length");
	}
}